

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

u32string *
anon_unknown.dwarf_d849::cpputf8_u16_to_u32(u32string *__return_storage_ptr__,u16string *u16)

{
  undefined1 local_38 [8];
  string u8;
  u16string *u16_local;
  
  u8.field_2._8_8_ = u16;
  cpputf8_u16_to_u8((string *)local_38,u16);
  cpputf8_u8_to_u32(__return_storage_ptr__,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline
u32string cpputf8_u16_to_u32(const u16string& u16)
{
    // cpputf8 doesn't support this directly (it is, after all, designed to
    // handle UTF-8), so we need to do it in two steps
    const string u8 = cpputf8_u16_to_u8(u16);
    return cpputf8_u8_to_u32(u8);
}